

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void greet_prog_knight(CHAR_DATA *mob,CHAR_DATA *ch)

{
  bool bVar1;
  long in_RSI;
  char *in_stack_000011f8;
  CHAR_DATA *in_stack_00001200;
  char *in_stack_000012d8;
  CHAR_DATA *in_stack_000012e0;
  char *in_stack_00001370;
  CHAR_DATA *in_stack_00001378;
  char *in_stack_00002498;
  CHAR_DATA *in_stack_000024a0;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  
  bVar1 = is_npc(in_stack_ffffffffffffffe8);
  if (!bVar1) {
    if (*(short *)(in_RSI + 0x2dc) < 1) {
      do_cb(in_stack_000012e0,in_stack_000012d8);
      do_murder(in_stack_000024a0,in_stack_00002498);
    }
    else {
      do_say(in_stack_00001378,in_stack_00001370);
      do_slay(in_stack_00001200,in_stack_000011f8);
    }
  }
  return;
}

Assistant:

void greet_prog_knight(CHAR_DATA *mob, CHAR_DATA *ch)
{
	if (is_npc(ch))
		return;

	if (ch->ghost > 0)
	{
		do_say(mob, "Ghosts are not allowed in this place.");
		do_slay(mob, ch->name);
		return;
	}

	do_cb(mob, "Intruder! Intruder!");
	do_murder(mob, ch->name);
}